

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::setVideoMode(WindowImplX11 *this,VideoMode *mode)

{
  undefined8 uVar1;
  short sVar2;
  XRRModeInfo *pXVar3;
  RRCrtc RVar4;
  bool bVar5;
  XRRScreenResources *res;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  int xRandRMinor;
  int xRandRMajor;
  RROutput output;
  Window rootWindow;
  uint local_30;
  
  _rootWindow = VideoMode::getDesktopMode();
  bVar5 = operator==(mode,(VideoMode *)&rootWindow);
  if (!bVar5) {
    bVar5 = checkXRandR(this,&xRandRMajor,&xRandRMinor);
    if (bVar5) {
      rootWindow = *(undefined8 *)
                    (*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80);
      res = (XRRScreenResources *)XRRGetScreenResources();
      if (res == (XRRScreenResources *)0x0) {
        poVar7 = err();
        pcVar10 = 
        "Failed to get the current screen resources for fullscreen mode, switching to window mode";
        lVar6 = 0x58;
      }
      else {
        output = getOutputPrimary(this,&rootWindow,res,xRandRMajor,xRandRMinor);
        lVar6 = XRRGetOutputInfo(this->m_display,res,output);
        if (lVar6 == 0) {
          XRRFreeScreenResources(res);
        }
        else {
          if (*(short *)(lVar6 + 0x30) != 1) {
            lVar8 = XRRGetCrtcInfo(this->m_display,res,*(undefined8 *)(lVar6 + 8));
            if (lVar8 == 0) {
              XRRFreeScreenResources(res);
              XRRFreeOutputInfo(lVar6);
              poVar7 = err();
              pcVar10 = "Failed to get crtc info for fullscreen mode, switching to window mode";
              lVar6 = 0x45;
            }
            else {
              lVar9 = lVar8;
              if (res->nmode < 1) {
                bVar5 = false;
              }
              else {
                sVar2 = *(short *)(lVar8 + 0x20);
                pXVar3 = res->modes;
                lVar11 = 8;
                lVar12 = 1;
                bVar5 = false;
                do {
                  if ((sVar2 == 8) || (sVar2 == 2)) {
                    uVar1 = *(undefined8 *)((long)&res->modes->id + lVar11);
                    *(ulong *)((long)&res->modes->id + lVar11) =
                         CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
                  }
                  if ((*(uint *)((long)&pXVar3->id + lVar11) == mode->width) &&
                     (*(uint *)((long)&pXVar3->id + lVar11 + 4) == mode->height)) {
                    lVar9 = *(long *)((long)pXVar3 + lVar11 + -8);
                    bVar5 = true;
                  }
                  if (res->nmode <= lVar12) break;
                  lVar11 = lVar11 + 0x50;
                  lVar12 = lVar12 + 1;
                } while (!bVar5);
              }
              if (bVar5) {
                this->m_oldVideoMode = *(RRMode *)(lVar8 + 0x18);
                RVar4 = *(RRCrtc *)(lVar6 + 8);
                this->m_oldRRCrtc = RVar4;
                XRRSetCrtcConfig(this->m_display,res,RVar4,0,*(undefined4 *)(lVar8 + 8),
                                 *(undefined4 *)(lVar8 + 0xc),lVar9,*(undefined2 *)(lVar8 + 0x20),
                                 &output,1);
                (anonymous_namespace)::WindowsImplX11Impl::fullscreenWindow = this;
                XRRFreeScreenResources(res);
                XRRFreeOutputInfo(lVar6);
                XRRFreeCrtcInfo(lVar8);
                return;
              }
              XRRFreeScreenResources(res);
              XRRFreeOutputInfo(lVar6);
              poVar7 = err();
              pcVar10 = 
              "Failed to find a matching RRMode for fullscreen mode, switching to window mode";
              lVar6 = 0x4e;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar6);
            std::endl<char,std::char_traits<char>>(poVar7);
            return;
          }
          XRRFreeScreenResources(res);
          XRRFreeOutputInfo(lVar6);
        }
        poVar7 = err();
        pcVar10 = "Failed to get output info for fullscreen mode, switching to window mode";
        lVar6 = 0x47;
      }
    }
    else {
      poVar7 = err();
      pcVar10 = "Fullscreen is not supported, switching to window mode";
      lVar6 = 0x35;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  return;
}

Assistant:

void WindowImplX11::setVideoMode(const VideoMode& mode)
{
    using namespace WindowsImplX11Impl;

    // Skip mode switching if the new mode is equal to the desktop mode
    if (mode == VideoMode::getDesktopMode())
        return;

    // Check if the XRandR extension is present
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
    {
        // XRandR extension is not supported: we cannot use fullscreen mode
        err() << "Fullscreen is not supported, switching to window mode" << std::endl;
        return;
    }

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Find RRMode to set
    bool modeFound = false;
    RRMode xRandMode;

    for (int i = 0; (i < res->nmode) && !modeFound; i++)
    {
        if (crtcInfo->rotation == RR_Rotate_90 || crtcInfo->rotation == RR_Rotate_270)
            std::swap(res->modes[i].height, res->modes[i].width);

        // Check if screen size match
        if ((res->modes[i].width == mode.width) &&
            (res->modes[i].height == mode.height))
        {
            xRandMode = res->modes[i].id;
            modeFound = true;
        }
    }

    if (!modeFound)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to find a matching RRMode for fullscreen mode, switching to window mode" << std::endl;
        return;
    }

    // Save the current video mode before we switch to fullscreen
    m_oldVideoMode = crtcInfo->mode;
    m_oldRRCrtc = outputInfo->crtc;

    // Switch to fullscreen mode
    XRRSetCrtcConfig(m_display,
                     res,
                     outputInfo->crtc,
                     CurrentTime,
                     crtcInfo->x,
                     crtcInfo->y,
                     xRandMode,
                     crtcInfo->rotation,
                     &output,
                     1);

    // Set "this" as the current fullscreen window
    fullscreenWindow = this;

    XRRFreeScreenResources(res);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeCrtcInfo(crtcInfo);
}